

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O3

int IPdr_ManRebuildClauses(Pdr_Man_t *p,Vec_Vec_t *vClauses)

{
  Vec_Vec_t *pVVar1;
  int iVar2;
  void **ppvVar3;
  void *pvVar4;
  uint uVar5;
  int level;
  Pdr_Man_t *pPVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  Pdr_Man_t *pCube;
  
  if (vClauses == (Vec_Vec_t *)0x0) {
    return -1;
  }
  if (vClauses->nSize < 2) {
    __assert_fail("Vec_VecSize(vClauses) >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                  ,0x10b,"int IPdr_ManRebuildClauses(Pdr_Man_t *, Vec_Vec_t *)");
  }
  pVVar1 = p->vClauses;
  if (pVVar1->nSize != 0) {
    __assert_fail("Vec_VecSize(p->vClauses) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                  ,0x10c,"int IPdr_ManRebuildClauses(Pdr_Man_t *, Vec_Vec_t *)");
  }
  iVar2 = 0;
  if (pVVar1->nCap < 2) {
    if (pVVar1->pArray == (void **)0x0) {
      ppvVar3 = (void **)malloc(0x10);
      pVVar1->pArray = ppvVar3;
      pVVar1->nCap = 2;
      iVar2 = 0;
    }
    else {
      ppvVar3 = (void **)realloc(pVVar1->pArray,0x10);
      pVVar1->pArray = ppvVar3;
      pVVar1->nCap = 2;
      iVar2 = pVVar1->nSize;
      if (1 < pVVar1->nSize) goto LAB_008ff127;
    }
  }
  lVar7 = (long)iVar2;
  do {
    lVar8 = lVar7 + 1;
    pvVar4 = calloc(1,0x10);
    pVVar1->pArray[lVar7] = pvVar4;
    lVar7 = lVar8;
  } while ((int)lVar8 != 2);
LAB_008ff127:
  pVVar1->nSize = 2;
  uVar5 = 0;
  pCube = p;
  IPdr_ManSetSolver(p,0,1);
  level = (int)pCube;
  iVar2 = vClauses->nSize;
  if (1 < iVar2) {
    uVar9 = 1;
    uVar5 = 0;
    do {
      pvVar4 = vClauses->pArray[uVar9];
      if (0 < *(int *)((long)pvVar4 + 4)) {
        lVar7 = 0;
        do {
          pCube = *(Pdr_Man_t **)(*(long *)((long)pvVar4 + 8) + lVar7 * 8);
          pPVar6 = p;
          iVar2 = Pdr_ManCheckCube(p,0,(Pdr_Set_t *)pCube,(Pdr_Set_t **)0x0,0,0,1);
          if (p->vActVars->nSize < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *p->vActVars->pArray = 0;
          if (iVar2 == 0) {
            Abc_Print((int)pPVar6,"Cube[%d][%d] cannot be pushed from R0 to R1.\n",
                      uVar9 & 0xffffffff);
            Pdr_SetDeref((Pdr_Set_t *)pCube);
          }
          else {
            if (iVar2 == -1) {
              __assert_fail("RetValue != -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                            ,0x11b,"int IPdr_ManRebuildClauses(Pdr_Man_t *, Vec_Vec_t *)");
            }
            pPVar6 = (Pdr_Man_t *)p->vClauses;
            Vec_VecPush((Vec_Vec_t *)pPVar6,1,pCube);
            pCube = pPVar6;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)pvVar4 + 4));
        iVar2 = vClauses->nSize;
        uVar5 = uVar5 + (int)lVar7;
      }
      level = (int)pCube;
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)iVar2);
  }
  if (1 < p->vClauses->nSize) {
    Abc_Print(level,"RebuildClauses: %d out of %d cubes reused in R1.\n",
              (ulong)*(uint *)((long)p->vClauses->pArray[1] + 4),(ulong)uVar5);
    IPdr_ManSetSolver(p,1,0);
    iVar2 = vClauses->nSize;
    if (0 < iVar2) {
      lVar7 = 0;
      do {
        pvVar4 = vClauses->pArray[lVar7];
        if (pvVar4 != (void *)0x0) {
          if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar4 + 8));
          }
          free(pvVar4);
          iVar2 = vClauses->nSize;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar2);
    }
    if (vClauses->pArray != (void **)0x0) {
      free(vClauses->pArray);
    }
    free(vClauses);
    return 0;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
}

Assistant:

int IPdr_ManRebuildClauses( Pdr_Man_t * p, Vec_Vec_t * vClauses )
{
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, j;
    int RetValue = -1;
    int nCubes = 0;

    if ( vClauses == NULL )
        return RetValue;

    assert( Vec_VecSize(vClauses) >= 2 );
    assert( Vec_VecSize(p->vClauses) == 0 ); 
    Vec_VecExpand( p->vClauses, 1 );

    IPdr_ManSetSolver( p, 0, 1 );

    // push clauses from R0 to R1
    Vec_VecForEachLevelStart( vClauses, vArrayK, i, 1 )
    {
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, j )
        {
            ++nCubes;

            RetValue = Pdr_ManCheckCube( p, 0, pCube, NULL, 0, 0, 1 );
            Vec_IntWriteEntry( p->vActVars, 0, 0 );

            assert( RetValue != -1 );

            if ( RetValue == 0 )
            {
                Abc_Print( 1, "Cube[%d][%d] cannot be pushed from R0 to R1.\n", i, j );
                Pdr_SetDeref( pCube );
                continue;
            }

            Vec_VecPush( p->vClauses, 1, pCube );
        }
    }
    Abc_Print( 1, "RebuildClauses: %d out of %d cubes reused in R1.\n", Vec_PtrSize(Vec_VecEntry(p->vClauses, 1)), nCubes );
    IPdr_ManSetSolver( p, 1, 0 );
    Vec_VecFree( vClauses );

    /*
    for ( i = 1; i < Vec_VecSize( vClauses ) - 1; ++i )
    {
        vArrayK = IPdr_ManPushClausesK( p, i );
        if ( Vec_PtrSize(vArrayK) == 0 )
        {
            Abc_Print( 1, "RebuildClauses: stopped at frame %d.\n", i );
            break;
        }

        Vec_PtrGrow( (Vec_Ptr_t *)(p->vClauses), i + 2 );
        p->vClauses->nSize = i + 2;
        p->vClauses->pArray[i+1] = vArrayK;
        IPdr_ManSetSolver( p, i + 1, 0 );
    }

    Abc_Print( 1, "After rebuild:" );
    Vec_VecForEachLevel( p->vClauses, vArrayK, i )
        Abc_Print( 1, " %d", Vec_PtrSize( vArrayK ) );
    Abc_Print( 1, "\n" );
    */

    return 0;
}